

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O3

CScript * __thiscall
anon_unknown.dwarf_5156e66::CScriptVisitor::operator()
          (CScript *__return_storage_ptr__,CScriptVisitor *this,WitnessUnknown *id)

{
  uint uVar1;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  opcodetype opcode;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  undefined1 local_38 [28];
  uint uStack_1c;
  CScript *local_18;
  
  local_18 = *(CScript **)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = 0;
  stack0xffffffffffffffe0 = 0;
  local_38._0_8_ = (char *)0x0;
  local_38._8_8_ = 0;
  uVar1 = *(uint *)this;
  if (0x10 < uVar1) {
    __assert_fail("n >= 0 && n <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/script.h"
                  ,0x20e,"static opcodetype CScript::EncodeOP_N(int)");
  }
  opcode = uVar1 + OP_RESERVED;
  if (uVar1 == 0) {
    opcode = OP_0;
  }
  this_00 = CScript::operator<<((CScript *)local_38,opcode);
  b._M_extent._M_extent_value = *(long *)(this + 0x10) - (long)*(pointer *)(this + 8);
  b._M_ptr = *(pointer *)(this + 8);
  other = &CScript::operator<<(this_00,b)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&__return_storage_ptr__->super_CScriptBase,other);
  if (0x1c < uStack_1c) {
    free((void *)local_38._0_8_);
  }
  if (*(CScript **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(CScript **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

CScript operator()(const WitnessUnknown& id) const
    {
        return CScript() << CScript::EncodeOP_N(id.GetWitnessVersion()) << id.GetWitnessProgram();
    }